

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

module_ * __thiscall pybind11::module_::def<void(*)(int)>(module_ *this,char *name_,type **f)

{
  type *f_00;
  handle local_48;
  cpp_function func;
  object local_38;
  scope local_30;
  name local_28;
  sibling local_20;
  
  f_00 = *f;
  local_30.value.m_ptr = (handle)(this->super_object).super_handle.m_ptr;
  local_38.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_28.value = name_;
  getattr((pybind11 *)&local_48,local_30.value,name_,(PyObject *)&_Py_NoneStruct);
  local_20.value.m_ptr = (handle)(handle)local_48.m_ptr;
  cpp_function::cpp_function<void,int,pybind11::name,pybind11::scope,pybind11::sibling>
            (&func,f_00,&local_28,&local_30,&local_20);
  object::~object((object *)&local_48);
  object::~object(&local_38);
  add_object(this,name_,(handle)func.super_function.super_object.super_handle.m_ptr,true);
  object::~object((object *)&func);
  return this;
}

Assistant:

module_ &def(const char *name_, Func &&f, const Extra& ... extra) {
        cpp_function func(std::forward<Func>(f), name(name_), scope(*this),
                          sibling(getattr(*this, name_, none())), extra...);
        // NB: allow overwriting here because cpp_function sets up a chain with the intention of
        // overwriting (and has already checked internally that it isn't overwriting non-functions).
        add_object(name_, func, true /* overwrite */);
        return *this;
    }